

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_script.cpp
# Opt level: O0

bool cfd::core::ContractHashUtil::CheckLiquidV1Watchman(Script *script)

{
  bool bVar1;
  ScriptOperator *pSVar2;
  char *pcVar3;
  CfdSourceLocation local_7e0;
  CfdSourceLocation local_7c8;
  ScriptElement local_7b0;
  ScriptElement local_750;
  CfdSourceLocation local_6f0;
  ScriptElement local_6d8;
  CfdSourceLocation local_678;
  int64_t local_660;
  int64_t req_num2;
  int local_650;
  char *local_648;
  ScriptElement local_640;
  CfdSourceLocation local_5e0;
  ScriptElement local_5c8;
  CfdSourceLocation local_568;
  ScriptElement local_550;
  CfdSourceLocation local_4f0;
  ScriptElement local_4d8;
  ScriptElement local_478;
  CfdSourceLocation local_418;
  ScriptElement local_400;
  int64_t local_3a0;
  int64_t req_num;
  int local_390;
  char *local_388;
  ScriptElement local_380;
  CfdSourceLocation local_320;
  ScriptElement local_308;
  CfdSourceLocation local_2a8;
  ScriptElement local_290;
  CfdSourceLocation local_230;
  ScriptElement local_218;
  undefined1 local_1b8 [8];
  ScriptElement element;
  allocator local_f1;
  string local_f0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_d0;
  undefined1 local_b8 [8];
  IteratorWrapper<cfd::core::ScriptElement> ite;
  CfdSourceLocation local_58;
  undefined1 local_30 [8];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  Script *script_local;
  
  list.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)script;
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)local_30
             ,script);
  bVar1 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::empty
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     local_30);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x3f;
    local_58.funcname = "CheckLiquidV1Watchman";
    logger::warn<>(&local_58,"script empty.");
    script_local._7_1_ = false;
    ite._84_4_ = 1;
  }
  else {
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
              (&local_d0,
               (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"Check LiquidV1 Watchman NG",&local_f1);
    IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper
              ((IteratorWrapper<cfd::core::ScriptElement> *)local_b8,&local_d0,&local_f0,false);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_d0);
    IteratorWrapper<cfd::core::ScriptElement>::next
              ((ScriptElement *)&element.value_,
               (IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
    pSVar2 = ScriptElement::GetOpCode((ScriptElement *)&element.value_);
    bVar1 = ScriptOperator::operator!=(pSVar2,(ScriptOperator *)ScriptOperator::OP_DEPTH);
    ScriptElement::~ScriptElement((ScriptElement *)&element.value_);
    if (bVar1) {
      script_local._7_1_ = false;
      ite._84_4_ = 1;
    }
    else {
      ScriptElement::ScriptElement((ScriptElement *)local_1b8,0);
      IteratorWrapper<cfd::core::ScriptElement>::next
                (&local_218,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
      bVar1 = ScriptElement::IsNumber(&local_218);
      ScriptElement::~ScriptElement(&local_218);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        IteratorWrapper<cfd::core::ScriptElement>::next
                  (&local_290,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
        pSVar2 = ScriptElement::GetOpCode(&local_290);
        bVar1 = ScriptOperator::operator!=(pSVar2,(ScriptOperator *)ScriptOperator::OP_EQUAL);
        ScriptElement::~ScriptElement(&local_290);
        if (bVar1) {
          local_2a8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                       ,0x2f);
          local_2a8.filename = local_2a8.filename + 1;
          local_2a8.line = 0x50;
          local_2a8.funcname = "CheckLiquidV1Watchman";
          logger::warn<>(&local_2a8,"LiquidV1 watchman script fail.");
          script_local._7_1_ = false;
        }
        else {
          IteratorWrapper<cfd::core::ScriptElement>::next
                    (&local_308,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
          pSVar2 = ScriptElement::GetOpCode(&local_308);
          bVar1 = ScriptOperator::operator!=(pSVar2,(ScriptOperator *)ScriptOperator::OP_IF);
          ScriptElement::~ScriptElement(&local_308);
          if (bVar1) {
            local_320.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                         ,0x2f);
            local_320.filename = local_320.filename + 1;
            local_320.line = 0x55;
            local_320.funcname = "CheckLiquidV1Watchman";
            logger::warn<>(&local_320,"LiquidV1 watchman script fail.");
            script_local._7_1_ = false;
          }
          else {
            IteratorWrapper<cfd::core::ScriptElement>::next
                      (&local_380,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
            ScriptElement::operator=((ScriptElement *)local_1b8,&local_380);
            ScriptElement::~ScriptElement(&local_380);
            bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_1b8);
            if ((bVar1) && (bVar1 = ScriptElement::IsNumber((ScriptElement *)local_1b8), bVar1)) {
              local_3a0 = ScriptElement::GetNumber((ScriptElement *)local_1b8);
              IteratorWrapper<cfd::core::ScriptElement>::next
                        (&local_400,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
              ScriptElement::operator=((ScriptElement *)local_1b8,&local_400);
              ScriptElement::~ScriptElement(&local_400);
              while( true ) {
                pSVar2 = ScriptElement::GetOpCode((ScriptElement *)local_1b8);
                bVar1 = ScriptOperator::operator!=(pSVar2,(ScriptOperator *)ScriptOperator::OP_ELSE)
                ;
                if (!bVar1) break;
                bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_1b8);
                if ((!bVar1) &&
                   (bVar1 = ScriptElement::IsBinary((ScriptElement *)local_1b8), !bVar1)) {
                  local_418.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                               ,0x2f);
                  local_418.filename = local_418.filename + 1;
                  local_418.line = 100;
                  local_418.funcname = "CheckLiquidV1Watchman";
                  logger::warn<>(&local_418,"LiquidV1 watchman script fail.");
                  script_local._7_1_ = false;
                  goto LAB_00605877;
                }
                IteratorWrapper<cfd::core::ScriptElement>::next
                          (&local_478,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                ScriptElement::operator=((ScriptElement *)local_1b8,&local_478);
                ScriptElement::~ScriptElement(&local_478);
              }
              IteratorWrapper<cfd::core::ScriptElement>::next
                        (&local_4d8,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
              bVar1 = ScriptElement::IsNumber(&local_4d8);
              ScriptElement::~ScriptElement(&local_4d8);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                IteratorWrapper<cfd::core::ScriptElement>::next
                          (&local_550,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                pSVar2 = ScriptElement::GetOpCode(&local_550);
                bVar1 = ScriptOperator::operator!=
                                  (pSVar2,(ScriptOperator *)ScriptOperator::OP_CHECKSEQUENCEVERIFY);
                ScriptElement::~ScriptElement(&local_550);
                if (bVar1) {
                  local_568.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                               ,0x2f);
                  local_568.filename = local_568.filename + 1;
                  local_568.line = 0x6f;
                  local_568.funcname = "CheckLiquidV1Watchman";
                  logger::warn<>(&local_568,"LiquidV1 watchman script fail.");
                  script_local._7_1_ = false;
                }
                else {
                  IteratorWrapper<cfd::core::ScriptElement>::next
                            (&local_5c8,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                  pSVar2 = ScriptElement::GetOpCode(&local_5c8);
                  bVar1 = ScriptOperator::operator!=
                                    (pSVar2,(ScriptOperator *)ScriptOperator::OP_DROP);
                  ScriptElement::~ScriptElement(&local_5c8);
                  if (bVar1) {
                    local_5e0.filename =
                         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                 ,0x2f);
                    local_5e0.filename = local_5e0.filename + 1;
                    local_5e0.line = 0x73;
                    local_5e0.funcname = "CheckLiquidV1Watchman";
                    logger::warn<>(&local_5e0,"LiquidV1 watchman script fail.");
                    script_local._7_1_ = false;
                  }
                  else {
                    IteratorWrapper<cfd::core::ScriptElement>::next
                              (&local_640,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                    ScriptElement::operator=((ScriptElement *)local_1b8,&local_640);
                    ScriptElement::~ScriptElement(&local_640);
                    bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_1b8);
                    if ((bVar1) &&
                       (bVar1 = ScriptElement::IsNumber((ScriptElement *)local_1b8), bVar1)) {
                      local_660 = ScriptElement::GetNumber((ScriptElement *)local_1b8);
                      if (local_3a0 == local_660) {
                        local_678.filename =
                             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                     ,0x2f);
                        local_678.filename = local_678.filename + 1;
                        local_678.line = 0x7e;
                        local_678.funcname = "CheckLiquidV1Watchman";
                        logger::warn<>(&local_678,"LiquidV1 watchman script fail.");
                        script_local._7_1_ = false;
                      }
                      else {
                        IteratorWrapper<cfd::core::ScriptElement>::next
                                  (&local_6d8,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8)
                        ;
                        ScriptElement::operator=((ScriptElement *)local_1b8,&local_6d8);
                        ScriptElement::~ScriptElement(&local_6d8);
                        while( true ) {
                          pSVar2 = ScriptElement::GetOpCode((ScriptElement *)local_1b8);
                          bVar1 = ScriptOperator::operator!=
                                            (pSVar2,(ScriptOperator *)ScriptOperator::OP_ENDIF);
                          if (!bVar1) break;
                          bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_1b8);
                          if ((!bVar1) &&
                             (bVar1 = ScriptElement::IsBinary((ScriptElement *)local_1b8), !bVar1))
                          {
                            local_6f0.filename =
                                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                         ,0x2f);
                            local_6f0.filename = local_6f0.filename + 1;
                            local_6f0.line = 0x85;
                            local_6f0.funcname = "CheckLiquidV1Watchman";
                            logger::warn<>(&local_6f0,"LiquidV1 watchman script fail.");
                            script_local._7_1_ = false;
                            goto LAB_00605877;
                          }
                          IteratorWrapper<cfd::core::ScriptElement>::next
                                    (&local_750,
                                     (IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                          ScriptElement::operator=((ScriptElement *)local_1b8,&local_750);
                          ScriptElement::~ScriptElement(&local_750);
                        }
                        IteratorWrapper<cfd::core::ScriptElement>::next
                                  (&local_7b0,(IteratorWrapper<cfd::core::ScriptElement> *)local_b8)
                        ;
                        pSVar2 = ScriptElement::GetOpCode(&local_7b0);
                        bVar1 = ScriptOperator::operator!=
                                          (pSVar2,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG
                                          );
                        ScriptElement::~ScriptElement(&local_7b0);
                        if (bVar1) {
                          local_7c8.filename =
                               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                       ,0x2f);
                          local_7c8.filename = local_7c8.filename + 1;
                          local_7c8.line = 0x8c;
                          local_7c8.funcname = "CheckLiquidV1Watchman";
                          logger::warn<>(&local_7c8,"LiquidV1 watchman script fail.");
                          script_local._7_1_ = false;
                        }
                        else {
                          bVar1 = IteratorWrapper<cfd::core::ScriptElement>::hasNext
                                            ((IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
                          if (bVar1) {
                            local_7e0.filename =
                                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                         ,0x2f);
                            local_7e0.filename = local_7e0.filename + 1;
                            local_7e0.line = 0x90;
                            local_7e0.funcname = "CheckLiquidV1Watchman";
                            logger::warn<>(&local_7e0,"LiquidV1 watchman script fail.");
                            script_local._7_1_ = false;
                          }
                          else {
                            script_local._7_1_ = true;
                          }
                        }
                      }
                    }
                    else {
                      pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                                       ,0x2f);
                      req_num2 = (int64_t)(pcVar3 + 1);
                      local_650 = 0x78;
                      local_648 = "CheckLiquidV1Watchman";
                      logger::warn<>((CfdSourceLocation *)&req_num2,"LiquidV1 watchman script fail."
                                    );
                      script_local._7_1_ = false;
                    }
                  }
                }
              }
              else {
                local_4f0.filename =
                     strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                             ,0x2f);
                local_4f0.filename = local_4f0.filename + 1;
                local_4f0.line = 0x6b;
                local_4f0.funcname = "CheckLiquidV1Watchman";
                logger::warn<>(&local_4f0,"LiquidV1 watchman script fail.");
                script_local._7_1_ = false;
              }
            }
            else {
              pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                               ,0x2f);
              req_num = (int64_t)(pcVar3 + 1);
              local_390 = 0x5b;
              local_388 = "CheckLiquidV1Watchman";
              logger::warn<>((CfdSourceLocation *)&req_num,"LiquidV1 watchman script fail.");
              script_local._7_1_ = false;
            }
          }
        }
      }
      else {
        local_230.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_script.cpp"
                     ,0x2f);
        local_230.filename = local_230.filename + 1;
        local_230.line = 0x4c;
        local_230.funcname = "CheckLiquidV1Watchman";
        logger::warn<>(&local_230,"LiquidV1 watchman script fail.");
        script_local._7_1_ = false;
      }
LAB_00605877:
      ite._84_4_ = 1;
      ScriptElement::~ScriptElement((ScriptElement *)local_1b8);
    }
    IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper
              ((IteratorWrapper<cfd::core::ScriptElement> *)local_b8);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)local_30
            );
  return script_local._7_1_;
}

Assistant:

bool ContractHashUtil::CheckLiquidV1Watchman(const Script& script) {
  try {
    std::vector<ScriptElement> list = script.GetElementList();
    if (list.empty()) {
      warn(CFD_LOG_SOURCE, "script empty.");
      return false;
    }

    IteratorWrapper<ScriptElement> ite(list, "Check LiquidV1 Watchman NG");
    if (ite.next().GetOpCode() != ScriptOperator::OP_DEPTH) {
      // warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      // Does not log if it is different from the beginning of the script
      return false;
    }

    ScriptElement element(0);
    if (!ite.next().IsNumber()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_EQUAL) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    if (ite.next().GetOpCode() != ScriptOperator::OP_IF) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    element = ite.next();
    if (!(element.IsOpCode() && element.IsNumber())) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    int64_t req_num = element.GetNumber();

    // check pubkey
    element = ite.next();
    while (element.GetOpCode() != ScriptOperator::OP_ELSE) {
      if ((!element.IsOpCode()) && (!element.IsBinary())) {
        warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
        return false;
      }
      element = ite.next();
    }

    if (!ite.next().IsNumber()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_CHECKSEQUENCEVERIFY) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_DROP) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    element = ite.next();
    if (!(element.IsOpCode() && element.IsNumber())) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    int64_t req_num2 = element.GetNumber();

    if (req_num == req_num2) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    element = ite.next();
    while (element.GetOpCode() != ScriptOperator::OP_ENDIF) {
      if ((!element.IsOpCode()) && (!element.IsBinary())) {
        warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
        return false;
      }
      element = ite.next();
    }

    if (ite.next().GetOpCode() != ScriptOperator::OP_CHECKMULTISIG) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.hasNext()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    return true;
  } catch (...) {
    warn(CFD_LOG_SOURCE, "Check LiquidV1 Watchman exception.");
    return false;
  }
}